

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileTableDataWriter::FinalizeTable
          (SingleFileTableDataWriter *this,TableStatistics *global_stats,DataTableInfo *info,
          Serializer *serializer)

{
  undefined1 uVar1;
  undefined1 uVar2;
  MetadataWriter *pMVar3;
  pointer pcVar4;
  undefined1 auVar5 [8];
  ulong uVar6;
  ulong uVar7;
  pointer pointer_00;
  bool v1_0_0_storage;
  vector<duckdb::BlockPointer,_true> compat_block_pointers;
  MetaBlockPointer pointer;
  vector<duckdb::IndexStorageInfo,_true> index_storage_infos;
  case_insensitive_map_t<Value> options;
  BinarySerializer stats_serializer;
  undefined1 local_b71;
  SingleFileTableDataWriter *local_b70;
  idx_t *local_b68;
  DataTableInfo *local_b60;
  __buckets_ptr local_b58;
  pointer local_b50;
  vector<duckdb::BlockPointer,_true> local_b48;
  MetaBlockPointer local_b28;
  vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_> local_b18;
  undefined1 local_b00 [8];
  _Alloc_hider local_af8;
  char local_ae8 [16];
  ulong local_ad8;
  bool local_ad0;
  undefined1 local_ac8 [8];
  _Alloc_hider local_ac0;
  char local_ab0 [16];
  idx_t local_aa0;
  bool local_a98;
  undefined1 local_a90 [8];
  size_type local_a88;
  __node_base local_a80;
  size_type sStack_a78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a70;
  __node_base_ptr ap_Stack_a60 [79];
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  local_7e8;
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  local_7c8;
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  local_778;
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  local_728;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_6d8;
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  local_688;
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  local_638;
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  local_5e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_598;
  BinarySerializer local_560;
  
  local_b60 = info;
  local_b28 = MetadataWriter::GetMetaBlockPointer(this->table_data_writer);
  pMVar3 = this->table_data_writer;
  local_ac8[0] = (serializer->options).serialize_enum_as_string;
  local_ac8[1] = (serializer->options).serialize_default_values;
  pcVar4 = (serializer->options).serialization_compatibility.duckdb_version._M_dataplus._M_p;
  local_b70 = this;
  local_ac0._M_p = local_ab0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ac0,pcVar4,
             pcVar4 + (serializer->options).serialization_compatibility.duckdb_version.
                      _M_string_length);
  local_a98 = (serializer->options).serialization_compatibility.manually_set;
  local_aa0 = (serializer->options).serialization_compatibility.serialization_version;
  BinarySerializer::BinarySerializer
            (&local_560,&pMVar3->super_WriteStream,(SerializationOptions *)local_ac8);
  if (local_ac0._M_p != local_ab0) {
    operator_delete(local_ac0._M_p);
  }
  BinarySerializer::OnObjectBegin(&local_560);
  TableStatistics::Serialize(global_stats,&local_560.super_Serializer);
  BinarySerializer::OnObjectEnd(&local_560);
  local_a90 = (undefined1  [8])
              ((long)(local_b70->super_TableDataWriter).row_group_pointers.
                     super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>
                     .
                     super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_b70->super_TableDataWriter).row_group_pointers.
                     super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>
                     .
                     super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 6);
  (**(local_b70->table_data_writer->super_WriteStream)._vptr_WriteStream)
            (local_b70->table_data_writer,local_a90,8);
  local_b68 = &(serializer->options).serialization_compatibility.serialization_version;
  pointer_00 = (local_b70->super_TableDataWriter).row_group_pointers.
               super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
               super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_b50 = (local_b70->super_TableDataWriter).row_group_pointers.
              super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
              super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (pointer_00 == local_b50) {
    uVar7 = 0;
  }
  else {
    local_b58 = (__buckets_ptr)&PTR__BinarySerializer_0196c678;
    uVar6 = 0;
    do {
      uVar7 = pointer_00->tuple_count + pointer_00->row_start;
      if (uVar7 <= uVar6) {
        uVar7 = uVar6;
      }
      pMVar3 = local_b70->table_data_writer;
      local_b00[0] = (serializer->options).serialize_enum_as_string;
      local_b00[1] = (serializer->options).serialize_default_values;
      local_af8._M_p = local_ae8;
      pcVar4 = (serializer->options).serialization_compatibility.duckdb_version._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_af8,pcVar4,
                 pcVar4 + (serializer->options).serialization_compatibility.duckdb_version.
                          _M_string_length);
      local_ad0 = *(bool *)(local_b68 + 1);
      local_ad8 = *local_b68;
      BinarySerializer::BinarySerializer
                ((BinarySerializer *)local_a90,&pMVar3->super_WriteStream,
                 (SerializationOptions *)local_b00);
      if (local_af8._M_p != local_ae8) {
        operator_delete(local_af8._M_p);
      }
      BinarySerializer::OnObjectBegin((BinarySerializer *)local_a90);
      RowGroup::Serialize(pointer_00,(Serializer *)local_a90);
      BinarySerializer::OnObjectEnd((BinarySerializer *)local_a90);
      local_a90 = (undefined1  [8])local_b58;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_598);
      ::std::
      _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
      ::~_Deque_base(&local_5e8);
      ::std::
      _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
      ::~_Deque_base(&local_638);
      ::std::
      _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
      ::~_Deque_base(&local_688);
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_6d8);
      ::std::
      _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
      ::~_Deque_base(&local_728);
      ::std::
      _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
      ::~_Deque_base(&local_778);
      ::std::
      _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
      ::~_Deque_base(&local_7c8);
      ::std::
      vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
      ::~vector(&local_7e8);
      Serializer::~Serializer((Serializer *)local_a90);
      pointer_00 = pointer_00 + 1;
      uVar6 = uVar7;
    } while (pointer_00 != local_b50);
  }
  Serializer::WriteProperty<duckdb::MetaBlockPointer>(serializer,0x65,"table_pointer",&local_b28);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"total_rows");
  (*serializer->_vptr_Serializer[0x15])(serializer,uVar7);
  (*serializer->_vptr_Serializer[3])(serializer);
  auVar5 = local_a90;
  uVar1 = (serializer->options).serialize_enum_as_string;
  uVar2 = (serializer->options).serialize_default_values;
  local_a90[1] = uVar2;
  local_a90[0] = uVar1;
  local_a90._2_6_ = auVar5._2_6_;
  pcVar4 = (serializer->options).serialization_compatibility.duckdb_version._M_dataplus._M_p;
  local_a88 = (size_type)&sStack_a78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a88,pcVar4,
             pcVar4 + (serializer->options).serialization_compatibility.duckdb_version.
                      _M_string_length);
  ap_Stack_a60[0] = (__node_base_ptr)CONCAT71(ap_Stack_a60[0]._1_7_,*(bool *)(local_b68 + 1));
  uVar7 = *local_b68;
  if ((size_type *)local_a88 != &sStack_a78) {
    local_a70._8_8_ = uVar7;
    operator_delete((void *)local_a88);
  }
  local_a90 = (undefined1  [8])ap_Stack_a60;
  local_a88 = 1;
  local_a80._M_nxt = (_Hash_node_base *)0x0;
  sStack_a78 = 0;
  local_a70._M_allocated_capacity._0_4_ = 0x3f800000;
  local_a70._8_8_ = 0;
  ap_Stack_a60[0] = (__node_base_ptr)0x0;
  local_b71 = uVar7 < 3;
  if (!(bool)local_b71) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[15],bool&>
              (local_a90,
               (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)"v1_0_0_storage",&local_b71);
  }
  TableIndexList::GetStorageInfos
            ((vector<duckdb::IndexStorageInfo,_true> *)&local_b18,&local_b60->indexes,
             (case_insensitive_map_t<Value> *)local_a90);
  local_b48.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b48.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b48.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"index_pointers");
  Serializer::WriteValue<duckdb::BlockPointer>(serializer,&local_b48);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::IndexStorageInfo,true>>
            (serializer,0x68,"index_storage_infos",
             (vector<duckdb::IndexStorageInfo,_true> *)&local_b18);
  if (local_b48.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
      super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b48.
                    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::~vector
            (&local_b18);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a90);
  local_560.super_Serializer._vptr_Serializer = (_func_int **)&PTR__BinarySerializer_0196c678;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_560.data.customs._M_h);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
                  *)&local_560.data.compression_infos);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                  *)&local_560.data.types);
  ::std::
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
                  *)&local_560.data.parameter_data);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_560.data.enums);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                  *)&local_560.data.catalogs);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
                  *)&local_560.data.databases);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                  *)&local_560.data);
  ::std::
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ::~vector(&local_560.debug_stack.
             super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
           );
  Serializer::~Serializer(&local_560.super_Serializer);
  return;
}

Assistant:

void SingleFileTableDataWriter::FinalizeTable(const TableStatistics &global_stats, DataTableInfo *info,
                                              Serializer &serializer) {

	// store the current position in the metadata writer
	// this is where the row groups for this table start
	auto pointer = table_data_writer.GetMetaBlockPointer();

	// Serialize statistics as a single unit
	BinarySerializer stats_serializer(table_data_writer, serializer.GetOptions());
	stats_serializer.Begin();
	global_stats.Serialize(stats_serializer);
	stats_serializer.End();

	// now start writing the row group pointers to disk
	table_data_writer.Write<uint64_t>(row_group_pointers.size());
	idx_t total_rows = 0;
	for (auto &row_group_pointer : row_group_pointers) {
		auto row_group_count = row_group_pointer.row_start + row_group_pointer.tuple_count;
		if (row_group_count > total_rows) {
			total_rows = row_group_count;
		}

		// Each RowGroup is its own unit
		BinarySerializer row_group_serializer(table_data_writer, serializer.GetOptions());
		row_group_serializer.Begin();
		RowGroup::Serialize(row_group_pointer, row_group_serializer);
		row_group_serializer.End();
	}

	// Now begin the metadata as a unit
	// Pointer to the table itself goes to the metadata stream.
	serializer.WriteProperty(101, "table_pointer", pointer);
	serializer.WriteProperty(102, "total_rows", total_rows);

	auto v1_0_0_storage = serializer.GetOptions().serialization_compatibility.serialization_version < 3;
	case_insensitive_map_t<Value> options;
	if (!v1_0_0_storage) {
		options.emplace("v1_0_0_storage", v1_0_0_storage);
	}
	auto index_storage_infos = info->GetIndexes().GetStorageInfos(options);

#ifdef DUCKDB_BLOCK_VERIFICATION
	for (auto &entry : index_storage_infos) {
		for (auto &allocator : entry.allocator_infos) {
			for (auto &block : allocator.block_pointers) {
				checkpoint_manager.verify_block_usage_count[block.block_id]++;
			}
		}
	}
#endif

	// write empty block pointers for forwards compatibility
	vector<BlockPointer> compat_block_pointers;
	serializer.WriteProperty(103, "index_pointers", compat_block_pointers);
	serializer.WritePropertyWithDefault(104, "index_storage_infos", index_storage_infos);
}